

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_find_best_partitioning.cpp
# Opt level: O3

uint find_best_partition_candidates
               (block_size_descriptor *bsd,image_block *blk,uint partition_count,
               uint partition_search_limit,uint *best_partitions,uint requested_candidates)

{
  char *pcVar1;
  float fVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  __m128 afVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  block_size_descriptor *this;
  processed_line4 pVar19;
  byte bVar20;
  uint i;
  uint uVar21;
  undefined4 uVar22;
  ulong uVar23;
  byte *pbVar24;
  partition_info *ppVar25;
  float *pfVar26;
  short sVar27;
  uint uVar28;
  undefined4 in_register_0000000c;
  ulong uVar29;
  uint uVar30;
  uint64_t *puVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  partition_metrics *pm;
  partition_metrics *pm_00;
  ulong uVar43;
  uint i_8;
  int iVar44;
  uint uVar45;
  bool bVar46;
  bool bVar47;
  undefined1 this_error [4];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar74;
  float fVar75;
  undefined1 auVar73 [32];
  float fVar76;
  float fVar77;
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint16_t mscount [64];
  float line_lengths [4];
  uint64_t bitmaps [4];
  vfloat4 cluster_centers [4];
  uint samec_best_partitions [8];
  float samec_best_errors [8];
  uint uncor_best_partitions [8];
  float uncor_best_errors [8];
  uint interleave [16];
  uint64_t bitmasks [16];
  uint16_t partition_sequence [1024];
  float local_fd8;
  float local_fd4;
  long local_fd0;
  ulong local_fc8;
  ulong local_fc0;
  uint local_fb4;
  block_size_descriptor *local_fb0;
  ulong local_fa8;
  ulong local_fa0;
  ulong local_f98;
  ulong local_f90;
  uint *local_f88;
  ulong local_f80;
  ulong local_f78;
  ulong local_f70;
  ulong local_f68;
  ulong local_f60;
  ulong local_f58;
  uint64_t *local_f50;
  long local_f48;
  long local_f40;
  long local_f38 [2];
  undefined1 local_f28 [4];
  undefined1 auStack_f24 [4];
  undefined8 uStack_f20;
  float afStack_f18 [2];
  undefined8 uStack_f10;
  undefined1 local_f08 [32];
  undefined1 local_ee8 [32];
  undefined1 local_ec8 [32];
  float local_ea8 [2];
  undefined8 uStack_ea0;
  processed_line4 local_e98 [3];
  undefined1 auStack_e28 [16];
  undefined1 local_e18 [8];
  float afStack_e10 [2];
  undefined8 auStack_e08 [14];
  uint local_d98 [8];
  float local_d78 [8];
  uint local_d58 [8];
  float local_d38 [4];
  undefined8 auStack_d28 [2];
  partition_metrics local_d18 [6];
  undefined8 auStack_c48 [2];
  undefined1 local_c38 [8];
  undefined8 uStack_c30;
  float afStack_c28 [2];
  undefined8 uStack_c20;
  line3 local_c18;
  processed_line3 local_bf8;
  processed_line3 local_bd8;
  undefined8 local_838;
  float afStack_830 [512];
  
  local_fc8 = CONCAT44(in_register_0000000c,partition_search_limit);
  uVar43 = (ulong)partition_count;
  bVar3 = bsd->texel_count;
  uVar29 = (ulong)bVar3;
  if (uVar29 < 0x15) {
    fVar50 = 0.03;
  }
  else if (bVar3 < 0x20) {
    fVar50 = 0.04;
  }
  else {
    fVar50 = *(float *)(&DAT_0032c218 + (ulong)(bVar3 < 0x2a) * 4);
  }
  local_fb4 = requested_candidates;
  if (partition_count == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x240,
                  "unsigned int find_best_partition_candidates(const block_size_descriptor &, const image_block &, unsigned int, unsigned int, unsigned int *, unsigned int)"
                 );
  }
  local_fb0 = bsd;
  local_f88 = best_partitions;
  if (partition_search_limit == 0) {
    __assert_fail("partition_search_limit > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x241,
                  "unsigned int find_best_partition_candidates(const block_size_descriptor &, const image_block &, unsigned int, unsigned int, unsigned int *, unsigned int)"
                 );
  }
  fVar2 = (blk->channel_weight).m[0];
  fVar74 = (blk->channel_weight).m[1];
  fVar75 = (blk->channel_weight).m[2];
  fVar77 = (blk->channel_weight).m[3];
  uVar40 = 2;
  if (2 < partition_count) {
    uVar40 = partition_count;
  }
  local_fa8 = uVar43 * 0x10;
  iVar38 = 0;
  while (uVar41 = (uint)bVar3, iVar38 != 0) {
    if (uVar41 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0xd9,
                    "void kmeans_update(const image_block &, unsigned int, unsigned int, vfloat4 *, const uint8_t *)"
                   );
    }
    afStack_830[6] = 0.0;
    afStack_830[7] = 0.0;
    afStack_830[8] = 0.0;
    afStack_830[9] = 0.0;
    afStack_830[10] = 0.0;
    afStack_830[0xb] = 0.0;
    afStack_830[0xc] = 0.0;
    afStack_830[0xd] = 0.0;
    local_838 = 0;
    afStack_830[0] = 0.0;
    afStack_830[1] = 0.0;
    afStack_830[2] = 0.0;
    afStack_830[3] = 0.0;
    afStack_830[4] = 0.0;
    afStack_830[5] = 0.0;
    auVar7._28_4_ = 0;
    auVar7._0_28_ = stack0xfffffffffffff3cc;
    _local_c38 = (line3)(auVar7 << 0x20);
    uVar23 = 0;
    do {
      auVar49 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar23]),ZEXT416((uint)blk->data_g[uVar23]),
                              0x10);
      auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_b[uVar23]),0x20);
      auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_a[uVar23]),0x30);
      bVar20 = *(byte *)((long)local_d18[0].avg.m + uVar23);
      local_c38[bVar20] = local_c38[bVar20] + '\x01';
      uVar37 = (ulong)bVar20;
      fVar81 = *(float *)((long)&local_838 + uVar37 * 0x10 + 4);
      fVar82 = afStack_830[uVar37 * 4];
      fVar83 = afStack_830[uVar37 * 4 + 1];
      *(float *)(&local_838 + uVar37 * 2) = auVar49._0_4_ + *(float *)(&local_838 + uVar37 * 2);
      *(float *)((long)&local_838 + uVar37 * 0x10 + 4) = auVar49._4_4_ + fVar81;
      afStack_830[uVar37 * 4] = auVar49._8_4_ + fVar82;
      afStack_830[uVar37 * 4 + 1] = auVar49._12_4_ + fVar83;
      uVar23 = uVar23 + 1;
    } while (uVar29 != uVar23);
    pbVar24 = local_c38;
    uVar23 = 0;
    do {
      fVar76 = 1.0 / (float)*pbVar24;
      fVar81 = *(float *)((long)&local_838 + uVar23 + 4);
      fVar82 = *(float *)((long)afStack_830 + uVar23);
      fVar83 = *(float *)((long)afStack_830 + uVar23 + 4);
      *(float *)(local_e18 + uVar23) = fVar76 * *(float *)((long)&local_838 + uVar23);
      *(float *)(local_e18 + uVar23 + 4) = fVar76 * fVar81;
      *(float *)((long)afStack_e10 + uVar23) = fVar76 * fVar82;
      *(float *)((long)auStack_e08 + (uVar23 - 4)) = fVar76 * fVar83;
      uVar23 = uVar23 + 0x10;
      pbVar24 = pbVar24 + 1;
    } while (local_fa8 != uVar23);
LAB_00269e57:
    if (uVar41 == 0) {
      __assert_fail("texel_count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                    ,0x99,
                    "void kmeans_assign(const image_block &, unsigned int, unsigned int, const vfloat4 *, uint8_t *)"
                   );
    }
    local_838 = local_838 & 0xffffffff00000000;
    uVar23 = 0;
    do {
      auVar49 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar23]),ZEXT416((uint)blk->data_g[uVar23]),
                              0x10);
      auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_b[uVar23]),0x20);
      auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_a[uVar23]),0x30);
      uVar35 = 0;
      auVar51 = SUB6416(ZEXT464(0x7f7fffff),0);
      uVar37 = 0;
      pauVar33 = (undefined1 (*) [16])local_e18;
      do {
        auVar87 = vsubps_avx(auVar49,*pauVar33);
        auVar85._0_4_ = fVar2 * auVar87._0_4_ * auVar87._0_4_;
        auVar85._4_4_ = fVar74 * auVar87._4_4_ * auVar87._4_4_;
        auVar85._8_4_ = fVar75 * auVar87._8_4_ * auVar87._8_4_;
        auVar85._12_4_ = fVar77 * auVar87._12_4_ * auVar87._12_4_;
        auVar87 = vshufpd_avx(auVar85,auVar85,1);
        auVar86._0_4_ = auVar85._0_4_ + auVar87._0_4_;
        auVar86._4_4_ = auVar85._4_4_ + auVar87._4_4_;
        auVar86._8_4_ = auVar85._8_4_ + auVar87._8_4_;
        auVar86._12_4_ = auVar85._12_4_ + auVar87._12_4_;
        auVar87 = vhaddps_avx(auVar86,auVar86);
        if (auVar87._0_4_ < auVar51._0_4_) {
          uVar37 = uVar35 & 0xffffffff;
        }
        auVar51 = vminss_avx(auVar87,auVar51);
        uVar35 = uVar35 + 1;
        pauVar33 = pauVar33 + 1;
      } while (uVar43 != uVar35);
      *(char *)((long)&local_838 + uVar37) = *(char *)((long)&local_838 + uVar37) + '\x01';
      *(char *)((long)local_d18[0].avg.m + uVar23) = (char)uVar37;
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar29);
    uVar23 = 0;
    bVar47 = false;
    do {
      while (*(char *)((long)&local_838 + uVar23) == '\0') {
        pcVar1 = (char *)((long)&local_838 + (ulong)*(byte *)((long)local_d18[0].avg.m + uVar23));
        *pcVar1 = *pcVar1 + -1;
        *(char *)((long)&local_838 + uVar23) = *(char *)((long)&local_838 + uVar23) + '\x01';
        *(char *)((long)local_d18[0].avg.m + uVar23) = (char)uVar23;
        uVar21 = (int)uVar23 + 1;
        bVar47 = uVar21 < partition_count;
        uVar23 = (ulong)uVar21;
        if (!bVar47) {
          uVar23 = 0;
        }
      }
      uVar21 = (int)uVar23 + 1;
      bVar46 = uVar21 < partition_count;
      uVar23 = (ulong)uVar21;
      if (!bVar46) {
        uVar23 = 0;
      }
      bVar16 = (bool)(bVar46 | bVar47);
      bVar47 = (bool)(bVar47 & bVar46);
    } while (bVar16);
    iVar38 = iVar38 + 1;
    if (iVar38 == 3) {
      local_e98[0] = (processed_line4)(ZEXT1232(ZEXT812(0)) << 0x20);
      local_f80 = 0x40;
      if (bVar3 < 0x40) {
        local_f80 = (ulong)uVar41;
      }
      uVar29 = 0;
      do {
        pfVar26 = local_e98[0].amod.m +
                  (ulong)*(byte *)((long)local_d18[0].avg.m + (ulong)bsd->kmeans_texels[uVar29]) * 2
        ;
        *(ulong *)pfVar26 = *(ulong *)pfVar26 | 1L << ((byte)uVar29 & 0x3f);
        pVar19 = local_e98[0];
        uVar29 = uVar29 + 1;
      } while (local_f80 != uVar29);
      uVar40 = bsd->partitioning_count_selected[partition_count - 1];
      uVar29 = (ulong)uVar40;
      if (uVar29 == 0) {
        __assert_fail("active_count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                      ,0x174,
                      "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                     );
      }
      if (uVar43 == 2) {
        puVar31 = bsd->coverage_bitmaps_2[0] + 1;
        uVar23 = 0;
        do {
          uVar21 = (int)POPCOUNT(*puVar31 ^ local_e98[0].amod.m._8_8_) +
                   (int)POPCOUNT((*(uint64_t (*) [2])(puVar31 + -1))[0] ^ local_e98[0].amod.m._0_8_)
          ;
          uVar41 = (int)POPCOUNT((*(uint64_t (*) [2])(puVar31 + -1))[0] ^ local_e98[0].amod.m._8_8_)
                   + (int)POPCOUNT(*puVar31 ^ local_e98[0].amod.m._0_8_);
          if (uVar21 < uVar41) {
            uVar41 = uVar21;
          }
          bVar20 = (byte)(uVar41 >> 1);
          local_c38[uVar23] = bVar20;
          if ((char)uVar41 < '\0') {
            __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                          ,0x17b,
                          "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                         );
          }
          if (bVar3 <= bVar20) {
            __assert_fail("mismatch_counts[i] < bsd.texel_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                          ,0x17c,
                          "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                         );
          }
          uVar23 = uVar23 + 1;
          puVar31 = puVar31 + 2;
        } while (uVar29 != uVar23);
      }
      else if (partition_count == 3) {
        local_f90._0_4_ = (int)local_e98[0].amod.m[0];
        local_f90._4_4_ = local_e98[0].amod.m[1];
        local_f98._0_4_ = (int)local_e98[0].amod.m[2];
        local_f98._4_4_ = local_e98[0].amod.m[3];
        local_fa0._0_4_ = (int)local_e98[0].bs.m[0];
        local_fa0._4_4_ = local_e98[0].bs.m[1];
        puVar31 = bsd->coverage_bitmaps_3[0] + 2;
        uVar23 = 0;
        do {
          uVar37 = (*(uint64_t (*) [3])(puVar31 + -2))[0];
          uVar35 = puVar31[-1];
          local_fd0 = POPCOUNT(uVar37 ^ local_e98[0].amod.m._0_8_);
          local_fc0 = POPCOUNT(uVar35 ^ local_e98[0].amod.m._0_8_);
          uVar36 = *puVar31;
          iVar38 = (int)POPCOUNT(uVar36 ^ local_e98[0].bs.m._0_8_);
          iVar10 = (int)POPCOUNT(uVar35 ^ local_e98[0].amod.m._8_8_);
          uVar21 = iVar38 + iVar10;
          iVar11 = (int)POPCOUNT(uVar36 ^ local_e98[0].amod.m._8_8_);
          iVar34 = (int)POPCOUNT(uVar35 ^ local_e98[0].bs.m._0_8_);
          uVar41 = iVar11 + iVar34;
          if (uVar21 < uVar41) {
            uVar41 = uVar21;
          }
          iVar39 = (int)POPCOUNT(uVar37 ^ local_e98[0].amod.m._8_8_);
          uVar30 = iVar38 + iVar39;
          iVar38 = (int)POPCOUNT(uVar37 ^ local_e98[0].bs.m._0_8_);
          uVar21 = iVar11 + iVar38;
          if (uVar30 < uVar21) {
            uVar21 = uVar30;
          }
          uVar28 = iVar34 + iVar39;
          uVar30 = iVar10 + iVar38;
          if (uVar28 < uVar30) {
            uVar30 = uVar28;
          }
          uVar30 = uVar30 + (int)POPCOUNT(uVar36 ^ local_e98[0].amod.m._0_8_);
          uVar28 = uVar21 + (uint)local_fc0;
          if (uVar41 + (int)(float)local_fd0 < uVar21 + (uint)local_fc0) {
            uVar28 = uVar41 + (int)(float)local_fd0;
          }
          if (uVar30 <= uVar28) {
            uVar28 = uVar30;
          }
          bVar20 = (byte)uVar28 >> 1;
          local_c38[uVar23] = bVar20;
          if ((char)(byte)uVar28 < '\0') {
            local_e98[0] = pVar19;
            __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                          ,0x184,
                          "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                         );
          }
          if (bVar3 <= bVar20) {
            local_e98[0] = pVar19;
            __assert_fail("mismatch_counts[i] < bsd.texel_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                          ,0x185,
                          "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                         );
          }
          uVar23 = uVar23 + 1;
          puVar31 = puVar31 + 3;
        } while (uVar29 != uVar23);
      }
      else {
        local_f58._0_4_ = local_e98[0].amod.m[0];
        local_f58._4_4_ = local_e98[0].amod.m[1];
        local_f60._0_4_ = local_e98[0].amod.m[2];
        local_f60._4_4_ = local_e98[0].amod.m[3];
        local_f68._0_4_ = local_e98[0].bs.m[0];
        local_f68._4_4_ = local_e98[0].bs.m[1];
        local_e98[0].bs.m._8_8_ = pVar19.bs.m._8_8_;
        local_f70._0_4_ = local_e98[0].bs.m[2];
        local_f70._4_4_ = local_e98[0].bs.m[3];
        uVar23 = 0;
        puVar31 = bsd->coverage_bitmaps_4[0] + 3;
        do {
          local_f50 = puVar31;
          local_fc0 = uVar23;
          uVar23 = (*(uint64_t (*) [4])(local_f50 + -3))[0];
          uVar37 = local_f50[-2];
          local_fa0 = POPCOUNT(uVar23 ^ local_e98[0].amod.m._0_8_);
          local_f98 = POPCOUNT(uVar37 ^ local_e98[0].amod.m._0_8_);
          uVar35 = local_f50[-1];
          local_f90 = POPCOUNT(uVar35 ^ local_e98[0].amod.m._0_8_);
          uVar36 = *local_f50;
          local_fd0 = POPCOUNT(uVar36 ^ local_e98[0].amod.m._0_8_);
          local_f38[1] = POPCOUNT(uVar23 ^ local_e98[0].amod.m._8_8_);
          local_f38[0] = POPCOUNT(uVar37 ^ local_e98[0].amod.m._8_8_);
          local_f40 = POPCOUNT(uVar35 ^ local_e98[0].amod.m._8_8_);
          local_f48 = POPCOUNT(uVar23 ^ local_e98[0].bs.m._0_8_);
          iVar38 = (int)POPCOUNT(uVar36 ^ local_e98[0].bs.m._8_8_);
          iVar10 = (int)POPCOUNT(uVar35 ^ local_e98[0].bs.m._0_8_);
          iVar11 = (int)POPCOUNT(uVar36 ^ local_e98[0].bs.m._0_8_);
          iVar34 = (int)POPCOUNT(uVar35 ^ local_e98[0].bs.m._8_8_);
          uVar41 = iVar11 + iVar34;
          if ((uint)(iVar38 + iVar10) < (uint)(iVar11 + iVar34)) {
            uVar41 = iVar38 + iVar10;
          }
          iVar39 = (int)POPCOUNT(uVar37 ^ local_e98[0].bs.m._0_8_);
          iVar12 = (int)POPCOUNT(uVar37 ^ local_e98[0].bs.m._8_8_);
          uVar21 = iVar11 + iVar12;
          if ((uint)(iVar38 + iVar39) < (uint)(iVar11 + iVar12)) {
            uVar21 = iVar38 + iVar39;
          }
          uVar30 = iVar10 + iVar12;
          if ((uint)(iVar34 + iVar39) < (uint)(iVar10 + iVar12)) {
            uVar30 = iVar34 + iVar39;
          }
          iVar42 = (int)local_f48;
          iVar44 = (int)POPCOUNT(uVar23 ^ local_e98[0].bs.m._8_8_);
          uVar28 = iVar11 + iVar44;
          if ((uint)(iVar38 + iVar42) < (uint)(iVar11 + iVar44)) {
            uVar28 = iVar38 + iVar42;
          }
          uVar13 = iVar10 + iVar44;
          if ((uint)(iVar34 + iVar42) < (uint)(iVar10 + iVar44)) {
            uVar13 = iVar34 + iVar42;
          }
          uVar14 = iVar12 + iVar42;
          if ((uint)(iVar39 + iVar44) < (uint)(iVar12 + iVar42)) {
            uVar14 = iVar39 + iVar44;
          }
          iVar38 = (int)local_f38[0];
          iVar10 = (int)local_f40;
          uVar45 = uVar21 + iVar10;
          if (uVar41 + iVar38 < uVar21 + iVar10) {
            uVar45 = uVar41 + iVar38;
          }
          iVar11 = (int)POPCOUNT(uVar36 ^ local_e98[0].amod.m._8_8_);
          if (uVar30 + iVar11 <= uVar45) {
            uVar45 = uVar30 + iVar11;
          }
          iVar34 = (int)local_f38[1];
          uVar15 = uVar41 + iVar34;
          if (uVar28 + iVar10 <= uVar41 + iVar34) {
            uVar15 = uVar28 + iVar10;
          }
          if (uVar13 + iVar11 <= uVar15) {
            uVar15 = uVar13 + iVar11;
          }
          uVar41 = uVar21 + iVar34;
          if (uVar28 + iVar38 < uVar21 + iVar34) {
            uVar41 = uVar28 + iVar38;
          }
          if (iVar11 + uVar14 <= uVar41) {
            uVar41 = iVar11 + uVar14;
          }
          uVar21 = uVar14 + iVar10;
          if (uVar13 + iVar38 < uVar14 + iVar10) {
            uVar21 = uVar13 + iVar38;
          }
          if (uVar30 + iVar34 <= uVar21) {
            uVar21 = uVar30 + iVar34;
          }
          uVar30 = uVar15 + (int)local_f98;
          if (uVar45 + (int)local_fa0 < uVar15 + (int)local_f98) {
            uVar30 = uVar45 + (int)local_fa0;
          }
          uVar28 = uVar21 + (int)(float)local_fd0;
          if (uVar41 + (int)local_f90 < uVar21 + (int)(float)local_fd0) {
            uVar28 = uVar41 + (int)local_f90;
          }
          if (uVar30 < uVar28) {
            uVar28 = uVar30;
          }
          bVar20 = (byte)(uVar28 >> 1);
          local_c38[local_fc0] = bVar20;
          local_f78 = uVar43;
          if (0x7f < uVar28) {
            local_e98[0] = pVar19;
            __assert_fail("mismatch_counts[i] < BLOCK_MAX_KMEANS_TEXELS",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                          ,0x18d,
                          "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                         );
          }
          if (bVar3 <= bVar20) {
            local_e98[0] = pVar19;
            __assert_fail("mismatch_counts[i] < bsd.texel_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                          ,0x18e,
                          "void count_partition_mismatch_bits(const block_size_descriptor &, unsigned int, const uint64_t *, uint8_t *)"
                         );
          }
          uVar23 = local_fc0 + 1;
          puVar31 = local_f50 + 4;
        } while (uVar29 != local_fc0 + 1);
      }
      local_ec8 = ZEXT432(0) << 0x20;
      local_ee8 = ZEXT432(0) << 0x20;
      local_f08 = ZEXT432(0) << 0x20;
      _local_f28 = ZEXT432(0) << 0x20;
      uVar23 = 0;
      local_e98[0] = pVar19;
      do {
        *(short *)(local_f28 + (ulong)(byte)local_c38[uVar23] * 2) =
             *(short *)(local_f28 + (ulong)(byte)local_c38[uVar23] * 2) + 1;
        uVar23 = uVar23 + 1;
      } while (uVar29 != uVar23);
      uVar23 = 0;
      sVar27 = 0;
      do {
        sVar4 = *(short *)(local_f28 + uVar23 * 2);
        *(short *)(local_f28 + uVar23 * 2) = sVar27;
        uVar23 = uVar23 + 1;
        sVar27 = sVar4 + sVar27;
      } while (local_f80 != uVar23);
      uVar23 = 0;
      do {
        uVar5 = *(ushort *)(local_f28 + (ulong)(byte)local_c38[uVar23] * 2);
        *(ushort *)(local_f28 + (ulong)(byte)local_c38[uVar23] * 2) = uVar5 + 1;
        *(short *)((long)&local_838 + (ulong)uVar5 * 2) = (short)uVar23;
        uVar23 = uVar23 + 1;
      } while (uVar29 != uVar23);
      if (uVar40 <= partition_search_limit) {
        local_fc8 = uVar29;
      }
      uVar41 = (uint)local_fc8;
      uVar40 = requested_candidates;
      if (uVar41 < requested_candidates) {
        uVar40 = uVar41;
      }
      auVar51 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                           *(undefined1 (*) [16])(blk->data_min).m,0);
      auVar51 = vblendps_avx(ZEXT816(0),auVar51,8);
      uVar22 = vmovmskps_avx(auVar51);
      if (requested_candidates != 0) {
        uVar29 = (ulong)(uVar40 + (uVar40 == 0));
        lVar32 = uVar29 - 1;
        auVar73._8_8_ = lVar32;
        auVar73._0_8_ = lVar32;
        auVar73._16_8_ = lVar32;
        auVar73._24_8_ = lVar32;
        uVar23 = 0;
        auVar8 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar9 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar68._8_8_ = 0x8000000000000000;
        auVar68._0_8_ = 0x8000000000000000;
        auVar68._16_8_ = 0x8000000000000000;
        auVar68._24_8_ = 0x8000000000000000;
        auVar7 = vpcmpeqd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar49));
        auVar84._8_4_ = 0x7149f2ca;
        auVar84._0_8_ = 0x7149f2ca7149f2ca;
        auVar84._12_4_ = 0x7149f2ca;
        auVar84._16_4_ = 0x7149f2ca;
        auVar84._20_4_ = 0x7149f2ca;
        auVar84._24_4_ = 0x7149f2ca;
        auVar84._28_4_ = 0x7149f2ca;
        do {
          auVar90._8_8_ = uVar23;
          auVar90._0_8_ = uVar23;
          auVar90._16_8_ = uVar23;
          auVar90._24_8_ = uVar23;
          auVar91 = vpor_avx2(auVar90,auVar8);
          auVar90 = vpor_avx2(auVar90,auVar9);
          auVar90 = vpcmpgtq_avx2(auVar90 ^ auVar68,auVar73 ^ auVar68);
          auVar91 = vpcmpgtq_avx2(auVar91 ^ auVar68,auVar73 ^ auVar68);
          auVar90 = vpackssdw_avx2(auVar91,auVar90);
          auVar49 = vpackssdw_avx(SUB3216(auVar90 ^ auVar7,0),SUB3216(auVar90 ^ auVar7,0x10));
          auVar49 = vpshufd_avx(auVar49,0xd8);
          auVar90 = vpmovzxwd_avx2(auVar49);
          auVar91 = vpslld_avx2(auVar90,0x1f);
          auVar90 = vmaskmovps_avx(auVar91,auVar84);
          *(undefined1 (*) [32])(local_d38 + uVar23) = auVar90;
          auVar90 = vmaskmovps_avx(auVar91,auVar84);
          *(undefined1 (*) [32])(local_d58 + (uVar23 - 8)) = auVar90;
          uVar23 = uVar23 + 8;
        } while ((uVar29 + 7 & 0xfffffffffffffff8) != uVar23);
      }
      local_fd0 = CONCAT44(local_fd0._4_4_,fVar50 * fVar50);
      local_fc8 = (ulong)(uVar41 + (uVar41 == 0));
      if ((char)uVar22 == '\0') {
        uVar29 = 0;
        do {
          uVar5 = *(ushort *)((long)&local_838 + uVar29 * 2);
          ppVar25 = block_size_descriptor::get_raw_partition_info
                              (local_fb0,partition_count,(uint)uVar5);
          compute_avgs_and_dirs_4_comp(ppVar25,blk,(partition_metrics *)local_c38);
          lVar32 = 0x10;
          auVar49._8_4_ = 0x3f000000;
          auVar49._0_8_ = 0x3f0000003f000000;
          auVar49._12_4_ = 0x3f000000;
          uVar23 = uVar43;
          do {
            uVar17 = *(undefined8 *)((long)auStack_c48 + lVar32 + 8);
            *(undefined8 *)((long)auStack_d28 + lVar32) =
                 *(undefined8 *)((long)auStack_c48 + lVar32);
            *(undefined8 *)((long)auStack_d28 + lVar32 + 8) = uVar17;
            auVar51 = *(undefined1 (*) [16])((long)auStack_c48 + lVar32);
            auVar87 = *(undefined1 (*) [16])(local_c38 + lVar32);
            auVar63._0_4_ = auVar87._0_4_ * auVar87._0_4_;
            auVar63._4_4_ = auVar87._4_4_ * auVar87._4_4_;
            auVar63._8_4_ = auVar87._8_4_ * auVar87._8_4_;
            auVar63._12_4_ = auVar87._12_4_ * auVar87._12_4_;
            auVar88 = vshufpd_avx(auVar63,auVar63,1);
            auVar64._0_4_ = auVar63._0_4_ + auVar88._0_4_;
            auVar64._4_4_ = auVar63._4_4_ + auVar88._4_4_;
            auVar64._8_4_ = auVar63._8_4_ + auVar88._8_4_;
            auVar64._12_4_ = auVar63._12_4_ + auVar88._12_4_;
            auVar88 = vhaddps_avx(auVar64,auVar64);
            fVar50 = auVar88._0_4_;
            auVar70._4_4_ = fVar50;
            auVar70._0_4_ = fVar50;
            auVar70._8_4_ = fVar50;
            auVar70._12_4_ = fVar50;
            auVar88 = vsqrtps_avx(auVar70);
            auVar87 = vdivps_avx(auVar87,auVar88);
            if ((fVar50 == 0.0) && (!NAN(fVar50))) {
              auVar87 = auVar49;
            }
            *(undefined1 (*) [16])((long)local_d18[0].avg.m + lVar32) = auVar87;
            auVar88 = *(undefined1 (*) [16])((long)auStack_d28 + lVar32);
            auVar71._0_4_ = auVar88._0_4_ * auVar87._0_4_;
            auVar71._4_4_ = auVar88._4_4_ * auVar87._4_4_;
            auVar71._8_4_ = auVar88._8_4_ * auVar87._8_4_;
            auVar71._12_4_ = auVar88._12_4_ * auVar87._12_4_;
            auVar89 = vshufpd_avx(auVar71,auVar71,1);
            auVar72._0_4_ = auVar71._0_4_ + auVar89._0_4_;
            auVar72._4_4_ = auVar71._4_4_ + auVar89._4_4_;
            auVar72._8_4_ = auVar71._8_4_ + auVar89._8_4_;
            auVar72._12_4_ = auVar71._12_4_ + auVar89._12_4_;
            auVar89 = vhaddps_avx(auVar72,auVar72);
            fVar50 = auVar89._0_4_;
            auVar54._0_4_ = auVar87._0_4_ * fVar50;
            auVar54._4_4_ = auVar87._4_4_ * fVar50;
            auVar54._8_4_ = auVar87._8_4_ * fVar50;
            auVar54._12_4_ = auVar87._12_4_ * fVar50;
            auVar87 = vsubps_avx(auVar88,auVar54);
            *(undefined1 (*) [16])(auStack_e28 + lVar32) = auVar87;
            uVar17 = *(undefined8 *)((long)local_d18[0].avg.m + lVar32 + 8);
            *(undefined8 *)(local_e18 + lVar32) = *(undefined8 *)((long)local_d18[0].avg.m + lVar32)
            ;
            *(undefined8 *)((long)afStack_e10 + lVar32) = uVar17;
            *(undefined8 *)((long)local_f38 + lVar32) = 0;
            *(undefined8 *)(local_f28 + lVar32 + -8) = 0;
            auVar55._0_4_ = auVar51._0_4_ * auVar51._0_4_;
            auVar55._4_4_ = auVar51._4_4_ * auVar51._4_4_;
            auVar55._8_4_ = auVar51._8_4_ * auVar51._8_4_;
            auVar55._12_4_ = auVar51._12_4_ * auVar51._12_4_;
            auVar87 = vshufpd_avx(auVar55,auVar55,1);
            auVar56._0_4_ = auVar55._0_4_ + auVar87._0_4_;
            auVar56._4_4_ = auVar55._4_4_ + auVar87._4_4_;
            auVar56._8_4_ = auVar55._8_4_ + auVar87._8_4_;
            auVar56._12_4_ = auVar55._12_4_ + auVar87._12_4_;
            auVar87 = vhaddps_avx(auVar56,auVar56);
            fVar50 = auVar87._0_4_;
            auVar65._4_4_ = fVar50;
            auVar65._0_4_ = fVar50;
            auVar65._8_4_ = fVar50;
            auVar65._12_4_ = fVar50;
            auVar87 = vsqrtps_avx(auVar65);
            auVar51 = vdivps_avx(auVar51,auVar87);
            if ((fVar50 == 0.0) && (!NAN(fVar50))) {
              auVar51 = auVar49;
            }
            *(undefined1 (*) [16])(local_f28 + lVar32) = auVar51;
            *(undefined8 *)((long)local_ea8 + lVar32) = 0;
            *(undefined8 *)((long)&uStack_ea0 + lVar32) = 0;
            uVar17 = *(undefined8 *)((long)&uStack_f20 + lVar32);
            *(undefined8 *)((long)local_e98[0].amod.m + lVar32) =
                 *(undefined8 *)(local_f28 + lVar32);
            *(undefined8 *)((long)local_e98[0].amod.m + lVar32 + 8) = uVar17;
            lVar32 = lVar32 + 0x20;
            uVar23 = uVar23 - 1;
          } while (uVar23 != 0);
          local_fd4 = 0.0;
          local_fd8 = 0.0;
          compute_error_squared_rgba
                    (ppVar25,blk,(processed_line4 *)local_e18,local_e98,local_ea8,&local_fd4,
                     &local_fd8);
          lVar32 = 0x10;
          uVar23 = 0;
          do {
            fVar2 = (float)local_fd0 * (float)ppVar25->partition_texel_count[uVar23];
            fVar50 = local_ea8[uVar23];
            fVar77 = fVar50 * *(float *)((long)local_d18[0].avg.m + lVar32);
            fVar81 = fVar50 * *(float *)((long)local_d18[0].avg.m + lVar32 + 4);
            fVar82 = fVar50 * *(float *)((long)local_d18[0].avg.m + lVar32 + 8);
            fVar83 = fVar50 * *(float *)((long)local_d18[0].avg.m + lVar32 + 0xc);
            fVar74 = fVar50 * *(float *)((long)&uStack_f20 + lVar32);
            fVar75 = fVar50 * *(float *)((long)&uStack_f20 + lVar32 + 4);
            auVar79._0_4_ = fVar2 * fVar77 * fVar77;
            auVar79._4_4_ = fVar2 * fVar81 * fVar81;
            auVar79._8_4_ = fVar2 * fVar82 * fVar82;
            auVar79._12_4_ = fVar2 * fVar83 * fVar83;
            auVar49 = vshufpd_avx(auVar79,auVar79,1);
            auVar80._0_4_ = auVar79._0_4_ + auVar49._0_4_;
            auVar80._4_4_ = auVar79._4_4_ + auVar49._4_4_;
            auVar80._8_4_ = auVar79._8_4_ + auVar49._8_4_;
            auVar80._12_4_ = auVar79._12_4_ + auVar49._12_4_;
            auVar49 = vhaddps_avx(auVar80,auVar80);
            local_fd4 = local_fd4 + auVar49._0_4_;
            auVar66._0_4_ =
                 fVar2 * fVar50 * *(float *)(local_f28 + lVar32) *
                         fVar50 * *(float *)(local_f28 + lVar32);
            auVar66._4_4_ =
                 fVar2 * fVar50 * *(float *)(local_f28 + lVar32 + 4) *
                         fVar50 * *(float *)(local_f28 + lVar32 + 4);
            auVar66._8_4_ = fVar2 * fVar74 * fVar74;
            auVar66._12_4_ = fVar2 * fVar75 * fVar75;
            auVar49 = vshufpd_avx(auVar66,auVar66,1);
            auVar67._0_4_ = auVar66._0_4_ + auVar49._0_4_;
            auVar67._4_4_ = auVar66._4_4_ + auVar49._4_4_;
            auVar67._8_4_ = auVar66._8_4_ + auVar49._8_4_;
            auVar67._12_4_ = auVar66._12_4_ + auVar49._12_4_;
            auVar49 = vhaddps_avx(auVar67,auVar67);
            local_fd8 = local_fd8 + auVar49._0_4_;
            uVar23 = uVar23 + 1;
            lVar32 = lVar32 + 0x20;
          } while (uVar43 != uVar23);
          insert_result(uVar40,local_fd4,(uint)uVar5,local_d38,local_d58);
          insert_result(uVar40,local_fd8,(uint)uVar5,local_d78,local_d98);
          uVar29 = uVar29 + 1;
        } while (uVar29 != local_fc8);
      }
      else {
        uVar29 = 0;
        do {
          uVar41 = (uint)*(ushort *)((long)&local_838 + uVar29 * 2);
          local_fc0 = CONCAT44(local_fc0._4_4_,uVar41);
          local_fa8 = uVar29;
          ppVar25 = block_size_descriptor::get_raw_partition_info(local_fb0,partition_count,uVar41);
          pm_00 = local_d18;
          compute_avgs_and_dirs_3_comp_rgb(ppVar25,blk,pm_00);
          lVar32 = 0;
          do {
            uVar17 = *(undefined8 *)((pm_00->avg).m + 2);
            *(undefined8 *)(local_c38 + lVar32) = *(undefined8 *)(pm_00->avg).m;
            *(undefined8 *)((long)afStack_c28 + lVar32 + -8) = uVar17;
            auVar49 = *(undefined1 (*) [16])(pm_00->dir).m;
            auVar52._0_4_ = auVar49._0_4_ * auVar49._0_4_;
            auVar52._4_4_ = auVar49._4_4_ * auVar49._4_4_;
            auVar52._8_4_ = auVar49._8_4_ * auVar49._8_4_;
            auVar52._12_4_ = auVar49._12_4_ * auVar49._12_4_;
            auVar51 = vshufpd_avx(auVar52,auVar52,1);
            auVar53._0_4_ = auVar52._0_4_ + auVar51._0_4_;
            auVar53._4_4_ = auVar52._4_4_ + auVar51._4_4_;
            auVar53._8_4_ = auVar52._8_4_ + auVar51._8_4_;
            auVar53._12_4_ = auVar52._12_4_ + auVar51._12_4_;
            auVar51 = vhaddps_avx(auVar53,auVar53);
            fVar50 = auVar51._0_4_;
            auVar57._4_4_ = fVar50;
            auVar57._0_4_ = fVar50;
            auVar57._8_4_ = fVar50;
            auVar57._12_4_ = fVar50;
            auVar51 = vsqrtps_avx(auVar57);
            auVar49 = vdivps_avx(auVar49,auVar51);
            if ((fVar50 == 0.0) && (!NAN(fVar50))) {
              auVar49 = _DAT_0032c230;
            }
            *(undefined1 (*) [16])((long)afStack_c28 + lVar32) = auVar49;
            *(undefined8 *)((long)local_c18.a.m + lVar32) = 0;
            *(undefined8 *)((long)local_c18.a.m + lVar32 + 8) = 0;
            auVar51 = *(undefined1 (*) [16])(pm_00->avg).m;
            auVar58._0_4_ = auVar51._0_4_ * auVar51._0_4_;
            auVar58._4_4_ = auVar51._4_4_ * auVar51._4_4_;
            auVar58._8_4_ = auVar51._8_4_ * auVar51._8_4_;
            auVar58._12_4_ = auVar51._12_4_ * auVar51._12_4_;
            auVar87 = vshufpd_avx(auVar58,auVar58,1);
            auVar59._0_4_ = auVar58._0_4_ + auVar87._0_4_;
            auVar59._4_4_ = auVar58._4_4_ + auVar87._4_4_;
            auVar59._8_4_ = auVar58._8_4_ + auVar87._8_4_;
            auVar59._12_4_ = auVar58._12_4_ + auVar87._12_4_;
            auVar87 = vhaddps_avx(auVar59,auVar59);
            fVar50 = auVar87._0_4_;
            auVar69._4_4_ = fVar50;
            auVar69._0_4_ = fVar50;
            auVar69._8_4_ = fVar50;
            auVar69._12_4_ = fVar50;
            auVar87 = vsqrtps_avx(auVar69);
            auVar51 = vdivps_avx(auVar51,auVar87);
            if ((fVar50 == 0.0) && (!NAN(fVar50))) {
              auVar51 = _DAT_0032c230;
            }
            *(undefined1 (*) [16])((long)local_c18.b.m + lVar32) = auVar51;
            auVar51 = *(undefined1 (*) [16])(local_c38 + lVar32);
            auVar60._0_4_ = auVar51._0_4_ * auVar49._0_4_;
            auVar60._4_4_ = auVar51._4_4_ * auVar49._4_4_;
            auVar60._8_4_ = auVar51._8_4_ * auVar49._8_4_;
            auVar60._12_4_ = auVar51._12_4_ * auVar49._12_4_;
            auVar87 = vhaddps_avx(auVar60,auVar60);
            auVar88 = vshufpd_avx(auVar60,auVar60,1);
            auVar61._0_4_ = auVar88._0_4_ + auVar87._0_4_;
            auVar61._4_4_ = auVar88._4_4_ + auVar87._4_4_;
            auVar61._8_8_ = 0;
            auVar87 = vpshufd_avx(auVar61,0xc0);
            auVar48._0_4_ = auVar49._0_4_ * auVar87._0_4_;
            auVar48._4_4_ = auVar49._4_4_ * auVar87._4_4_;
            auVar48._8_4_ = auVar49._8_4_ * auVar87._8_4_;
            auVar48._12_4_ = auVar49._12_4_ * auVar87._12_4_;
            auVar49 = vsubps_avx(auVar51,auVar48);
            *(undefined1 (*) [16])((long)local_bf8.amod.m + lVar32) = auVar49;
            uVar17 = *(undefined8 *)((long)&uStack_c20 + lVar32);
            *(undefined8 *)((long)local_bf8.bs.m + lVar32) =
                 *(undefined8 *)((long)afStack_c28 + lVar32);
            *(undefined8 *)((long)local_bf8.bs.m + lVar32 + 8) = uVar17;
            *(undefined8 *)((long)local_bd8.amod.m + lVar32) = 0;
            *(undefined8 *)((long)local_bd8.amod.m + lVar32 + 8) = 0;
            uVar17 = *(undefined8 *)((long)local_c18.b.m + lVar32 + 8);
            *(undefined8 *)((long)local_bd8.bs.m + lVar32) =
                 *(undefined8 *)((long)local_c18.b.m + lVar32);
            *(undefined8 *)((long)local_bd8.bs.m + lVar32 + 8) = uVar17;
            pm_00 = pm_00 + 1;
            lVar32 = lVar32 + 0x90;
          } while (uVar43 * 0x90 != lVar32);
          auVar8._28_4_ = 0;
          auVar8._0_28_ = _auStack_f24;
          _local_f28 = auVar8 << 0x20;
          auVar18._12_4_ = 0;
          auVar18._0_12_ = stack0xfffffffffffff1ec;
          _local_e18 = (__m128)(auVar18 << 0x20);
          compute_error_squared_rgb
                    (ppVar25,blk,(partition_lines3 *)local_c38,(float *)local_f28,(float *)local_e18
                    );
          pfVar26 = afStack_c28;
          uVar29 = 0;
          this_error = local_f28;
          fVar50 = (float)local_e18._0_4_;
          do {
            fVar74 = (float)local_fd0 * (float)ppVar25->partition_texel_count[uVar29];
            fVar2 = pfVar26[0x1c];
            auVar78._0_4_ = fVar74 * fVar2 * *pfVar26 * fVar2 * *pfVar26;
            auVar78._4_4_ = fVar74 * fVar2 * pfVar26[1] * fVar2 * pfVar26[1];
            auVar78._8_4_ = fVar74 * fVar2 * pfVar26[2] * fVar2 * pfVar26[2];
            auVar78._12_4_ = fVar74 * fVar2 * pfVar26[3] * fVar2 * pfVar26[3];
            auVar49 = vhaddps_avx(auVar78,auVar78);
            auVar87 = vshufpd_avx(auVar78,auVar78,1);
            auVar62._0_4_ = fVar74 * fVar2 * pfVar26[8] * fVar2 * pfVar26[8];
            auVar62._4_4_ = fVar74 * fVar2 * pfVar26[9] * fVar2 * pfVar26[9];
            auVar62._8_4_ = fVar74 * fVar2 * pfVar26[10] * fVar2 * pfVar26[10];
            auVar62._12_4_ = fVar74 * fVar2 * pfVar26[0xb] * fVar2 * pfVar26[0xb];
            auVar51 = vhaddps_avx(auVar62,auVar62);
            this_error = (undefined1  [4])((float)this_error + auVar87._0_4_ + auVar49._0_4_);
            auVar49 = vshufpd_avx(auVar62,auVar62,1);
            fVar50 = fVar50 + auVar49._0_4_ + auVar51._0_4_;
            uVar29 = uVar29 + 1;
            pfVar26 = pfVar26 + 0x24;
          } while (uVar43 != uVar29);
          local_f28 = this_error;
          local_e18._0_4_ = fVar50;
          uVar41 = (uint)local_fc0;
          insert_result(uVar40,(float)this_error,(uint)local_fc0,local_d38,local_d58);
          insert_result(uVar40,(float)local_e18._0_4_,uVar41,local_d78,local_d98);
          uVar29 = local_fa8 + 1;
        } while (uVar29 != local_fc8);
      }
      this = local_fb0;
      if (local_fb4 != 0) {
        uVar29 = 0;
        do {
          ppVar25 = block_size_descriptor::get_raw_partition_info
                              (this,partition_count,*(uint *)((long)local_d58 + uVar29 * 2));
          local_d18[0].avg.m[uVar29 & 0xffffffff] = (float)(uint)ppVar25->partition_index;
          ppVar25 = block_size_descriptor::get_raw_partition_info
                              (this,partition_count,*(uint *)((long)local_d98 + uVar29 * 2));
          local_d18[0].avg.m[(int)uVar29 + 1] = (float)(uint)ppVar25->partition_index;
          uVar29 = uVar29 + 2;
        } while ((ulong)(uVar40 + (uVar40 == 0)) * 2 != uVar29);
      }
      auVar49 = ZEXT816(0) << 0x40;
      local_bd8 = (processed_line3)ZEXT1632(auVar49);
      local_bf8 = (processed_line3)ZEXT1632(auVar49);
      local_c18 = (line3)ZEXT1632(auVar49);
      _local_c38 = (line3)ZEXT1632(auVar49);
      if (uVar40 * 2 == 0) {
        uVar41 = 0;
      }
      else {
        uVar29 = 0;
        uVar41 = 0;
        do {
          fVar50 = local_d18[0].avg.m[uVar29];
          uVar43 = *(ulong *)(local_c38 + (ulong)((uint)fVar50 >> 6) * 8);
          if ((uVar43 >> ((ulong)(uint)fVar50 & 0x3f) & 1) == 0) {
            local_f88[uVar41] = (uint)fVar50;
            *(ulong *)(local_c38 + (ulong)((uint)fVar50 >> 6) * 8) =
                 1L << (SUB41(fVar50,0) & 0x3f) | uVar43;
            uVar41 = uVar41 + 1;
            if (uVar41 == uVar40) {
              return uVar40;
            }
          }
          uVar29 = uVar29 + 1;
        } while (uVar40 * 2 != uVar29);
      }
      return uVar41;
    }
  }
  if (uVar29 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_find_best_partitioning.cpp"
                  ,0x42,
                  "void kmeans_init(const image_block &, unsigned int, unsigned int, vfloat4 *)");
  }
  uVar23 = 0x239e9 % uVar29;
  auVar49 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar23]),ZEXT416((uint)blk->data_g[uVar23]),0x10
                         );
  auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_b[uVar23]),0x20);
  afVar6 = (__m128)vinsertps_avx(auVar49,ZEXT416((uint)blk->data_a[uVar23]),0x30);
  local_e18._0_4_ = afVar6[0];
  local_e18._4_4_ = afVar6[1];
  afStack_e10[0] = afVar6[2];
  afStack_e10[1] = afVar6[3];
  fVar81 = 0.0;
  uVar23 = 0;
  do {
    auVar49 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar23]),ZEXT416((uint)blk->data_g[uVar23]),
                            0x10);
    auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_b[uVar23]),0x20);
    auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_a[uVar23]),0x30);
    auVar49 = vsubps_avx(auVar49,(undefined1  [16])afVar6);
    auVar51._0_4_ = fVar2 * auVar49._0_4_ * auVar49._0_4_;
    auVar51._4_4_ = fVar74 * auVar49._4_4_ * auVar49._4_4_;
    auVar51._8_4_ = fVar75 * auVar49._8_4_ * auVar49._8_4_;
    auVar51._12_4_ = fVar77 * auVar49._12_4_ * auVar49._12_4_;
    auVar49 = vshufpd_avx(auVar51,auVar51,1);
    auVar87._0_4_ = auVar51._0_4_ + auVar49._0_4_;
    auVar87._4_4_ = auVar51._4_4_ + auVar49._4_4_;
    auVar87._8_4_ = auVar51._8_4_ + auVar49._8_4_;
    auVar87._12_4_ = auVar51._12_4_ + auVar49._12_4_;
    auVar49 = vhaddps_avx(auVar87,auVar87);
    fVar81 = fVar81 + auVar49._0_4_;
    *(float *)((long)&local_838 + uVar23 * 4) = auVar49._0_4_;
    uVar23 = uVar23 + 1;
  } while (uVar29 != uVar23);
  uVar23 = 1;
  uVar21 = partition_count * 3 - 6;
  do {
    uVar37 = (ulong)uVar21;
    uVar21 = uVar21 + 1;
    fVar82 = 0.0;
    uVar35 = 0;
    do {
      fVar82 = fVar82 + *(float *)((long)&local_838 + uVar35 * 4);
      uVar36 = uVar35;
      if (fVar81 * *(float *)(&DAT_0032c640 + uVar37 * 4) <= fVar82) break;
      uVar35 = uVar35 + 1;
      uVar36 = uVar29;
    } while (uVar29 != uVar35);
    uVar37 = uVar36 & 0xffffffff;
    if (bVar3 - 1 <= (uint)uVar36) {
      uVar37 = (ulong)(bVar3 - 1);
    }
    auVar49 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar37]),ZEXT416((uint)blk->data_g[uVar37]),
                            0x10);
    auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_b[uVar37]),0x20);
    auVar49 = vinsertps_avx(auVar49,ZEXT416((uint)blk->data_a[uVar37]),0x30);
    *(undefined1 (*) [16])(local_e18 + uVar23 * 0x10) = auVar49;
    if (uVar23 == uVar40 - 1) goto LAB_00269e57;
    uVar23 = uVar23 + 1;
    fVar81 = 0.0;
    uVar37 = 0;
    do {
      auVar51 = vinsertps_avx(ZEXT416((uint)blk->data_r[uVar37]),ZEXT416((uint)blk->data_g[uVar37]),
                              0x10);
      auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)blk->data_b[uVar37]),0x20);
      auVar51 = vinsertps_avx(auVar51,ZEXT416((uint)blk->data_a[uVar37]),0x30);
      auVar51 = vsubps_avx(auVar51,auVar49);
      auVar88._0_4_ = fVar2 * auVar51._0_4_ * auVar51._0_4_;
      auVar88._4_4_ = fVar74 * auVar51._4_4_ * auVar51._4_4_;
      auVar88._8_4_ = fVar75 * auVar51._8_4_ * auVar51._8_4_;
      auVar88._12_4_ = fVar77 * auVar51._12_4_ * auVar51._12_4_;
      auVar51 = vshufpd_avx(auVar88,auVar88,1);
      auVar89._0_4_ = auVar88._0_4_ + auVar51._0_4_;
      auVar89._4_4_ = auVar88._4_4_ + auVar51._4_4_;
      auVar89._8_4_ = auVar88._8_4_ + auVar51._8_4_;
      auVar89._12_4_ = auVar88._12_4_ + auVar51._12_4_;
      auVar51 = vhaddps_avx(auVar89,auVar89);
      auVar51 = vminss_avx(auVar51,ZEXT416(*(uint *)((long)&local_838 + uVar37 * 4)));
      fVar81 = fVar81 + auVar51._0_4_;
      *(float *)((long)&local_838 + uVar37 * 4) = auVar51._0_4_;
      uVar37 = uVar37 + 1;
    } while (uVar29 != uVar37);
  } while( true );
}

Assistant:

unsigned int find_best_partition_candidates(
	const block_size_descriptor& bsd,
	const image_block& blk,
	unsigned int partition_count,
	unsigned int partition_search_limit,
	unsigned int best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES],
	unsigned int requested_candidates
) {
	// Constant used to estimate quantization error for a given partitioning; the optimal value for
	// this depends on bitrate. These values have been determined empirically.
	unsigned int texels_per_block = bsd.texel_count;
	float weight_imprecision_estim = 0.055f;
	if (texels_per_block <= 20)
	{
		weight_imprecision_estim = 0.03f;
	}
	else if (texels_per_block <= 31)
	{
		weight_imprecision_estim = 0.04f;
	}
	else if (texels_per_block <= 41)
	{
		weight_imprecision_estim = 0.05f;
	}

	promise(partition_count > 0);
	promise(partition_search_limit > 0);

	weight_imprecision_estim = weight_imprecision_estim * weight_imprecision_estim;

	uint16_t partition_sequence[BLOCK_MAX_PARTITIONINGS];
	unsigned int sequence_len = compute_kmeans_partition_ordering(bsd, blk, partition_count, partition_sequence);
	partition_search_limit = astc::min(partition_search_limit, sequence_len);
	requested_candidates = astc::min(partition_search_limit, requested_candidates);

	bool uses_alpha = !blk.is_constant_channel(3);

	// Partitioning errors assuming uncorrelated-chrominance endpoints
	float uncor_best_errors[TUNE_MAX_PARTITIONING_CANDIDATES];
	unsigned int uncor_best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES];

	// Partitioning errors assuming same-chrominance endpoints
	float samec_best_errors[TUNE_MAX_PARTITIONING_CANDIDATES];
	unsigned int samec_best_partitions[TUNE_MAX_PARTITIONING_CANDIDATES];

	for (unsigned int i = 0; i < requested_candidates; i++)
	{
		uncor_best_errors[i] = ERROR_CALC_DEFAULT;
		samec_best_errors[i] = ERROR_CALC_DEFAULT;
	}

	if (uses_alpha)
	{
		for (unsigned int i = 0; i < partition_search_limit; i++)
		{
			unsigned int partition = partition_sequence[i];
			const auto& pi = bsd.get_raw_partition_info(partition_count, partition);

			// Compute weighting to give to each component in each partition
			partition_metrics pms[BLOCK_MAX_PARTITIONS];

			compute_avgs_and_dirs_4_comp(pi, blk, pms);

			line4 uncor_lines[BLOCK_MAX_PARTITIONS];
			line4 samec_lines[BLOCK_MAX_PARTITIONS];

			processed_line4 uncor_plines[BLOCK_MAX_PARTITIONS];
			processed_line4 samec_plines[BLOCK_MAX_PARTITIONS];

			float line_lengths[BLOCK_MAX_PARTITIONS];

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_metrics& pm = pms[j];

				uncor_lines[j].a = pm.avg;
				uncor_lines[j].b = normalize_safe(pm.dir, unit4());

				uncor_plines[j].amod = uncor_lines[j].a - uncor_lines[j].b * dot(uncor_lines[j].a, uncor_lines[j].b);
				uncor_plines[j].bs = uncor_lines[j].b;

				samec_lines[j].a = vfloat4::zero();
				samec_lines[j].b = normalize_safe(pm.avg, unit4());

				samec_plines[j].amod = vfloat4::zero();
				samec_plines[j].bs = samec_lines[j].b;
			}

			float uncor_error = 0.0f;
			float samec_error = 0.0f;

			compute_error_squared_rgba(pi,
			                           blk,
			                           uncor_plines,
			                           samec_plines,
			                           line_lengths,
			                           uncor_error,
			                           samec_error);

			// Compute an estimate of error introduced by weight quantization imprecision.
			// This error is computed as follows, for each partition
			//     1: compute the principal-axis vector (full length) in error-space
			//     2: convert the principal-axis vector to regular RGB-space
			//     3: scale the vector by a constant that estimates average quantization error
			//     4: for each texel, square the vector, then do a dot-product with the texel's
			//        error weight; sum up the results across all texels.
			//     4(optimized): square the vector once, then do a dot-product with the average
			//        texel error, then multiply by the number of texels.

			for (unsigned int j = 0; j < partition_count; j++)
			{
				float tpp = static_cast<float>(pi.partition_texel_count[j]);
				vfloat4 error_weights(tpp * weight_imprecision_estim);

				vfloat4 uncor_vector = uncor_lines[j].b * line_lengths[j];
				vfloat4 samec_vector = samec_lines[j].b * line_lengths[j];

				uncor_error += dot_s(uncor_vector * uncor_vector, error_weights);
				samec_error += dot_s(samec_vector * samec_vector, error_weights);
			}

			insert_result(requested_candidates, uncor_error, partition, uncor_best_errors, uncor_best_partitions);
			insert_result(requested_candidates, samec_error, partition, samec_best_errors, samec_best_partitions);
		}
	}
	else
	{
		for (unsigned int i = 0; i < partition_search_limit; i++)
		{
			unsigned int partition = partition_sequence[i];
			const auto& pi = bsd.get_raw_partition_info(partition_count, partition);

			// Compute weighting to give to each component in each partition
			partition_metrics pms[BLOCK_MAX_PARTITIONS];
			compute_avgs_and_dirs_3_comp_rgb(pi, blk, pms);

			partition_lines3 plines[BLOCK_MAX_PARTITIONS];

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_metrics& pm = pms[j];
				partition_lines3& pl = plines[j];

				pl.uncor_line.a = pm.avg;
				pl.uncor_line.b = normalize_safe(pm.dir, unit3());

				pl.samec_line.a = vfloat4::zero();
				pl.samec_line.b = normalize_safe(pm.avg, unit3());

				pl.uncor_pline.amod = pl.uncor_line.a - pl.uncor_line.b * dot3(pl.uncor_line.a, pl.uncor_line.b);
				pl.uncor_pline.bs   = pl.uncor_line.b;

				pl.samec_pline.amod = vfloat4::zero();
				pl.samec_pline.bs   = pl.samec_line.b;
			}

			float uncor_error = 0.0f;
			float samec_error = 0.0f;

			compute_error_squared_rgb(pi,
			                          blk,
			                          plines,
			                          uncor_error,
			                          samec_error);

			// Compute an estimate of error introduced by weight quantization imprecision.
			// This error is computed as follows, for each partition
			//     1: compute the principal-axis vector (full length) in error-space
			//     2: convert the principal-axis vector to regular RGB-space
			//     3: scale the vector by a constant that estimates average quantization error
			//     4: for each texel, square the vector, then do a dot-product with the texel's
			//        error weight; sum up the results across all texels.
			//     4(optimized): square the vector once, then do a dot-product with the average
			//        texel error, then multiply by the number of texels.

			for (unsigned int j = 0; j < partition_count; j++)
			{
				partition_lines3& pl = plines[j];

				float tpp = static_cast<float>(pi.partition_texel_count[j]);
				vfloat4 error_weights(tpp * weight_imprecision_estim);

				vfloat4 uncor_vector = pl.uncor_line.b * pl.line_length;
				vfloat4 samec_vector = pl.samec_line.b * pl.line_length;

				uncor_error += dot3_s(uncor_vector * uncor_vector, error_weights);
				samec_error += dot3_s(samec_vector * samec_vector, error_weights);
			}

			insert_result(requested_candidates, uncor_error, partition, uncor_best_errors, uncor_best_partitions);
			insert_result(requested_candidates, samec_error, partition, samec_best_errors, samec_best_partitions);
		}
	}

	unsigned int interleave[2 * TUNE_MAX_PARTITIONING_CANDIDATES];
	for (unsigned int i = 0; i < requested_candidates; i++)
	{
		interleave[2 * i] = bsd.get_raw_partition_info(partition_count, uncor_best_partitions[i]).partition_index;
		interleave[2 * i + 1] = bsd.get_raw_partition_info(partition_count, samec_best_partitions[i]).partition_index;
	}

	uint64_t bitmasks[1024/64] { 0 };
	unsigned int emitted = 0;

	// Deduplicate the first "requested" entries
	for (unsigned int i = 0; i < requested_candidates * 2;  i++)
	{
		unsigned int partition = interleave[i];

		unsigned int word = partition / 64;
		unsigned int bit = partition % 64;

		bool written = bitmasks[word] & (1ull << bit);

		if (!written)
		{
			best_partitions[emitted] = partition;
			bitmasks[word] |= 1ull << bit;
			emitted++;

			if (emitted == requested_candidates)
			{
				break;
			}
		}
	}

	return emitted;
}